

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CollapseDatabaseArray(sqlite3 *db)

{
  undefined8 *puVar1;
  Db *pDVar2;
  Db *p;
  char *pcVar3;
  Btree *pBVar4;
  Schema *pSVar5;
  char *pcVar6;
  Btree *pBVar7;
  Schema *pSVar8;
  undefined7 uVar9;
  u8 uVar10;
  undefined7 uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  iVar12 = db->nDb;
  iVar14 = 2;
  if (2 < iVar12) {
    lVar15 = 2;
    lVar16 = 0x40;
    do {
      pDVar2 = db->aDb;
      puVar1 = (undefined8 *)((long)&pDVar2->zName + lVar16);
      if (*(long *)((long)&pDVar2->pBt + lVar16) == 0) {
        sqlite3DbFree(db,(void *)*puVar1);
        *puVar1 = 0;
      }
      else {
        lVar13 = (long)iVar14;
        if (lVar13 < lVar15) {
          pcVar3 = (char *)*puVar1;
          pBVar4 = (Btree *)puVar1[1];
          pSVar5 = (Schema *)puVar1[3];
          *(undefined8 *)&pDVar2[lVar13].safety_level = puVar1[2];
          *(Schema **)(&pDVar2[lVar13].safety_level + 8) = pSVar5;
          pDVar2[lVar13].zName = pcVar3;
          pDVar2[lVar13].pBt = pBVar4;
        }
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + 1;
      iVar12 = db->nDb;
      lVar16 = lVar16 + 0x20;
    } while (lVar15 < iVar12);
  }
  memset(db->aDb + iVar14,0,(long)(iVar12 - iVar14) << 5);
  db->nDb = iVar14;
  if (iVar14 < 3) {
    p = db->aDb;
    pDVar2 = db->aDbStatic;
    if (p != pDVar2) {
      pcVar3 = p->zName;
      pBVar4 = p->pBt;
      uVar10 = p->safety_level;
      uVar11 = *(undefined7 *)&p->field_0x11;
      pSVar5 = p->pSchema;
      pcVar6 = p[1].zName;
      pBVar7 = p[1].pBt;
      uVar9 = *(undefined7 *)&p[1].field_0x11;
      pSVar8 = p[1].pSchema;
      db->aDbStatic[1].safety_level = p[1].safety_level;
      *(undefined7 *)&db->aDbStatic[1].field_0x11 = uVar9;
      db->aDbStatic[1].pSchema = pSVar8;
      db->aDbStatic[1].zName = pcVar6;
      db->aDbStatic[1].pBt = pBVar7;
      db->aDbStatic[0].safety_level = uVar10;
      *(undefined7 *)&db->aDbStatic[0].field_0x11 = uVar11;
      db->aDbStatic[0].pSchema = pSVar5;
      pDVar2->zName = pcVar3;
      db->aDbStatic[0].pBt = pBVar4;
      sqlite3DbFree(db,p);
      db->aDb = pDVar2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CollapseDatabaseArray(sqlite3 *db){
  int i, j;
  for(i=j=2; i<db->nDb; i++){
    struct Db *pDb = &db->aDb[i];
    if( pDb->pBt==0 ){
      sqlite3DbFree(db, pDb->zName);
      pDb->zName = 0;
      continue;
    }
    if( j<i ){
      db->aDb[j] = db->aDb[i];
    }
    j++;
  }
  memset(&db->aDb[j], 0, (db->nDb-j)*sizeof(db->aDb[j]));
  db->nDb = j;
  if( db->nDb<=2 && db->aDb!=db->aDbStatic ){
    memcpy(db->aDbStatic, db->aDb, 2*sizeof(db->aDb[0]));
    sqlite3DbFree(db, db->aDb);
    db->aDb = db->aDbStatic;
  }
}